

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# body_centered_cubic.hpp
# Opt level: O1

void __thiscall
sisl::body_centered_cubic<char>::each_site
          (body_centered_cubic<char> *this,
          function<void_(const_Eigen::Matrix<int,__1,_1,_0,__1,_1>_&)> *func,bool parallel)

{
  bool bVar1;
  int *piVar2;
  CommaInitializer<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *this_00;
  undefined8 *puVar3;
  undefined8 uVar4;
  int iVar5;
  int iVar6;
  lattice_site s;
  Scalar local_7c;
  Matrix<int,__1,_1,_0,__1,_1> local_78;
  int local_5c;
  CommaInitializer<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> local_58;
  _Any_data *local_38;
  
  if (-1 < this->_nx) {
    iVar5 = 0;
    local_38 = (_Any_data *)func;
    do {
      if (-1 < this->_ny) {
        iVar6 = 0;
        do {
          local_7c = 0;
          if (-1 < this->_nz) {
            do {
              local_78.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data
                   = (int *)0x0;
              local_78.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows
                   = 0;
              free((void *)0x0);
              piVar2 = (int *)malloc(0xc);
              if (piVar2 == (int *)0x0) {
                puVar3 = (undefined8 *)__cxa_allocate_exception(8);
                *puVar3 = operator_delete;
                __cxa_throw(puVar3,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
              }
              local_78.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows
                   = 3;
              local_58.m_row = 0;
              local_58.m_col = 1;
              local_58.m_currentBlockRows = 1;
              *piVar2 = local_7c % 2 + iVar5;
              local_5c = local_7c % 2 + iVar6;
              local_78.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data
                   = piVar2;
              local_58.m_xpr = &local_78;
              this_00 = Eigen::CommaInitializer<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::operator_
                                  (&local_58,&local_5c);
              Eigen::CommaInitializer<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::operator_
                        (this_00,&local_7c);
              if ((local_58.m_currentBlockRows + local_58.m_row !=
                   ((local_58.m_xpr)->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).
                   m_storage.m_rows) || (local_58.m_col != 1)) {
                __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                              ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,
                              "XprType &Eigen::CommaInitializer<Eigen::Matrix<int, -1, 1>>::finished() [MatrixType = Eigen::Matrix<int, -1, 1>]"
                             );
              }
              if (((local_78.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
                    m_rows < 1) ||
                  (local_78.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
                   m_rows == 1)) ||
                 (local_78.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
                  m_rows < 3)) {
                __assert_fail("index >= 0 && index < size()",
                              "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x19a,
                              "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<int, -1, 1>, 1>::operator[](Index) [Derived = Eigen::Matrix<int, -1, 1>, Level = 1]"
                             );
              }
              if ((((-1 < *local_78.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                           m_storage.m_data) &&
                   (*local_78.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
                     m_data <= this->_nx)) &&
                  ((-1 < local_78.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                         m_storage.m_data[1] &&
                   ((local_78.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
                     m_data[1] <= this->_ny &&
                    (-1 < local_78.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                          m_storage.m_data[2])))))) &&
                 (local_78.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
                  m_data[2] <= this->_nz)) {
                if (*(long *)(local_38 + 1) == 0) {
                  uVar4 = std::__throw_bad_function_call();
                  free(local_78.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                       m_storage.m_data);
                  _Unwind_Resume(uVar4);
                }
                (**(code **)(local_38->_M_pod_data + 0x18))(local_38,&local_78);
              }
              free(local_78.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
                   m_data);
              bVar1 = local_7c < this->_nz;
              local_7c = local_7c + 1;
            } while (bVar1);
          }
          iVar6 = iVar6 + 2;
        } while (iVar6 <= this->_ny);
      }
      iVar5 = iVar5 + 2;
    } while (iVar5 <= this->_nx);
  }
  return;
}

Assistant:

virtual void each_site(const std::function<void(const lattice_site &)> &func, bool parallel = false) {
            #pragma omp parallel for if(parallel)
            for(int i = 0; i <= _nx; i+= 2)
                for(int j = 0; j <= _ny; j+=2)
                    for(int k = 0; k <= _nz; k++) {
                        lattice_site s(3);
                        int zmod = k % 2;
                        s << i+zmod,j+zmod,k;
                        if(in_bound(s[0], s[1],s[2]))
                            func(s);
                    }
        }